

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O3

ssize_t __thiscall Electron::VideoOutput::write(VideoOutput *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  ushort uVar8;
  int iVar9;
  sbyte sVar10;
  uint16_t uVar11;
  int byte;
  uint uVar12;
  ulong uVar13;
  sbyte sVar14;
  uint16_t uVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  uint8_t *puVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  
  uVar12 = __fd & 0xf;
  uVar13 = (ulong)uVar12;
  bVar16 = (byte)__buf;
  if (uVar12 - 8 < 8) {
    bVar16 = ~bVar16;
    lVar1 = (ulong)(__fd & 6) * 8;
    puVar19 = this->palette_ + *(int *)(&DAT_004c4ff0 + lVar1);
    if ((__fd & 1U) == 0) {
      *puVar19 = bVar16 >> 7 | *puVar19 & 6;
      lVar20 = (long)*(int *)(&DAT_004c4ff4 + lVar1);
      this->palette_[lVar20] = bVar16 >> 6 & 1 | this->palette_[lVar20] & 6;
      this->palette_[*(int *)(&DAT_004c4ff8 + lVar1)] =
           bVar16 >> 5 & 1 | this->palette_[*(int *)(&DAT_004c4ff8 + lVar1)] & 6;
      this->palette_[*(int *)(&DAT_004c4ffc + lVar1)] =
           bVar16 >> 4 & 1 | this->palette_[*(int *)(&DAT_004c4ffc + lVar1)] & 6;
      sVar10 = 1;
      sVar14 = 2;
    }
    else {
      *puVar19 = bVar16 >> 1 & 4 | *puVar19 & 3;
      this->palette_[*(int *)(&DAT_004c4ff4 + lVar1)] =
           bVar16 & 4 | this->palette_[*(int *)(&DAT_004c4ff4 + lVar1)] & 3;
      iVar9 = *(int *)(&DAT_004c4ff8 + lVar1);
      puVar19 = this->palette_ + iVar9;
      this->palette_[iVar9] = bVar16 * '\x02' & 4 | this->palette_[iVar9] & 3;
      lVar20 = (long)*(int *)(&DAT_004c4ffc + lVar1);
      this->palette_[lVar20] = bVar16 * '\x04' & 4 | this->palette_[lVar20] & 3;
      sVar10 = 3;
      sVar14 = 4;
    }
    *puVar19 = bVar16 >> sVar14 & 2 | *puVar19 & 5;
    this->palette_[lVar20] = bVar16 >> sVar10 & 2 | this->palette_[lVar20] & 5;
    uVar13 = 0;
    do {
      uVar12 = (uint)uVar13;
      uVar18 = (uint)(uVar13 >> 4) & 8;
      uVar2 = this->palette_[uVar18];
      *(uint8_t *)((this->palette_tables_).forty1bpp + uVar13) = uVar2;
      uVar22 = (uint)(uVar13 >> 3) & 8;
      uVar3 = this->palette_[uVar22];
      *(uint8_t *)((long)(this->palette_tables_).forty1bpp + uVar13 * 4 + 1) = uVar3;
      uVar21 = (uVar12 & 0x20) >> 2;
      uVar4 = this->palette_[uVar21];
      *(uint8_t *)((long)(this->palette_tables_).forty1bpp + uVar13 * 4 + 2) = uVar4;
      uVar17 = (uVar12 & 0x10) >> 1;
      uVar5 = this->palette_[uVar17];
      *(uint8_t *)((long)(this->palette_tables_).forty1bpp + uVar13 * 4 + 3) = uVar5;
      uVar18 = (uint)(uVar13 >> 2) & 2 | uVar18;
      uVar6 = this->palette_[uVar18];
      *(uint8_t *)((this->palette_tables_).eighty2bpp + uVar13) = uVar6;
      uVar22 = (uVar12 & 4) >> 1 | uVar22;
      uVar7 = this->palette_[uVar22];
      *(uint8_t *)((long)(this->palette_tables_).eighty2bpp + uVar13 * 4 + 1) = uVar7;
      uVar23 = uVar12 & 2;
      *(uint8_t *)((long)(this->palette_tables_).eighty2bpp + uVar13 * 4 + 2) =
           this->palette_[uVar21 | uVar23];
      uVar21 = uVar12 & 1;
      *(uint8_t *)((long)(this->palette_tables_).eighty2bpp + uVar13 * 4 + 3) =
           this->palette_[uVar17 + uVar21 * 2];
      *(uint8_t *)((this->palette_tables_).eighty1bpp + uVar13) = uVar2;
      *(uint8_t *)((long)(this->palette_tables_).eighty1bpp + uVar13 * 8 + 1) = uVar3;
      *(uint8_t *)((long)(this->palette_tables_).eighty1bpp + uVar13 * 8 + 2) = uVar4;
      *(uint8_t *)((long)(this->palette_tables_).eighty1bpp + uVar13 * 8 + 3) = uVar5;
      *(uint8_t *)((long)(this->palette_tables_).eighty1bpp + uVar13 * 8 + 4) =
           this->palette_[uVar12 & 8];
      *(uint8_t *)((long)(this->palette_tables_).eighty1bpp + uVar13 * 8 + 5) =
           this->palette_[(ulong)(uVar12 & 4) * 2];
      *(uint8_t *)((long)(this->palette_tables_).eighty1bpp + uVar13 * 8 + 6) =
           this->palette_[(ulong)uVar23 * 4];
      *(uint8_t *)((long)(this->palette_tables_).eighty1bpp + uVar13 * 8 + 7) =
           this->palette_[(ulong)uVar21 * 8];
      *(uint8_t *)((this->palette_tables_).forty2bpp + uVar13) = uVar6;
      *(uint8_t *)((long)(this->palette_tables_).forty2bpp + uVar13 * 2 + 1) = uVar7;
      *(uint8_t *)((this->palette_tables_).eighty4bpp + uVar13) =
           this->palette_[uVar23 >> 1 | (uVar12 & 0x20) >> 3 | uVar18];
      *(uint8_t *)((long)(this->palette_tables_).eighty4bpp + uVar13 * 2 + 1) =
           this->palette_[(uVar12 & 0x10) >> 2 | uVar22 | uVar21];
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0x100);
    return 0x100;
  }
  if (uVar12 == 7) {
    bVar16 = bVar16 >> 3 & 7;
    uVar13 = 4;
    if (bVar16 != 7) {
      uVar13 = (ulong)bVar16;
    }
    if ((uint8_t)uVar13 != this->screen_mode_) {
      this->screen_mode_ = (uint8_t)uVar13;
      uVar8 = *(ushort *)(&DAT_004c5048 + uVar13 * 2);
      this->screen_mode_base_address_ = uVar8;
      return (ulong)uVar8;
    }
  }
  else if (uVar12 == 3) {
    uVar12 = (uint)(bVar16 & 0x3f) << 9 | this->start_screen_address_ & 0x1ff;
    uVar13 = 0x8000;
    if ((short)uVar12 != 0) {
      uVar13 = (ulong)uVar12;
    }
    this->start_screen_address_ = (uint16_t)uVar13;
  }
  else if (uVar12 == 2) {
    uVar12 = (*(uint *)&this->start_screen_address_ & 0xfffffe00) + (uint)(bVar16 & 0xe0) * 2;
    uVar11 = (uint16_t)uVar12;
    uVar15 = 0x8000;
    if (uVar11 != 0) {
      uVar15 = uVar11;
    }
    this->start_screen_address_ = uVar15;
    return (ulong)uVar12;
  }
  return uVar13;
}

Assistant:

void VideoOutput::write(int address, uint8_t value) {
	switch(address & 0xf) {
		case 0x02:
			start_screen_address_ = (start_screen_address_ & 0xfe00) | uint16_t((value & 0xe0) << 1);
			if(!start_screen_address_) start_screen_address_ |= 0x8000;
		break;
		case 0x03:
			start_screen_address_ = (start_screen_address_ & 0x01ff) | uint16_t((value & 0x3f) << 9);
			if(!start_screen_address_) start_screen_address_ |= 0x8000;
		break;
		case 0x07: {
			// update screen mode
			uint8_t new_screen_mode = (value >> 3)&7;
			if(new_screen_mode == 7) new_screen_mode = 4;
			if(new_screen_mode != screen_mode_) {
				screen_mode_ = new_screen_mode;
				setup_base_address();
			}
		}
		break;
		case 0x08: case 0x09: case 0x0a: case 0x0b:
		case 0x0c: case 0x0d: case 0x0e: case 0x0f: {
			constexpr int registers[4][4] = {
				{10, 8, 2, 0},
				{14, 12, 6, 4},
				{15, 13, 7, 5},
				{11, 9, 3, 1},
			};
			const int index = (address >> 1)&3;
			const uint8_t colour = ~value;
			if(address&1) {
				palette_[registers[index][0]]	= (palette_[registers[index][0]]&3)	| ((colour >> 1)&4);
				palette_[registers[index][1]]	= (palette_[registers[index][1]]&3)	| ((colour >> 0)&4);
				palette_[registers[index][2]]	= (palette_[registers[index][2]]&3)	| ((colour << 1)&4);
				palette_[registers[index][3]]	= (palette_[registers[index][3]]&3)	| ((colour << 2)&4);

				palette_[registers[index][2]]	= (palette_[registers[index][2]]&5)	| ((colour >> 4)&2);
				palette_[registers[index][3]]	= (palette_[registers[index][3]]&5)	| ((colour >> 3)&2);
			} else {
				palette_[registers[index][0]]	= (palette_[registers[index][0]]&6)	| ((colour >> 7)&1);
				palette_[registers[index][1]]	= (palette_[registers[index][1]]&6)	| ((colour >> 6)&1);
				palette_[registers[index][2]]	= (palette_[registers[index][2]]&6)	| ((colour >> 5)&1);
				palette_[registers[index][3]]	= (palette_[registers[index][3]]&6)	| ((colour >> 4)&1);

				palette_[registers[index][0]]	= (palette_[registers[index][0]]&5)	| ((colour >> 2)&2);
				palette_[registers[index][1]]	= (palette_[registers[index][1]]&5)	| ((colour >> 1)&2);
			}

			// regenerate all palette tables for now
			for(int byte = 0; byte < 256; byte++) {
				uint8_t *target = reinterpret_cast<uint8_t *>(&palette_tables_.forty1bpp[byte]);
				target[0] = palette_[(byte&0x80) >> 4];
				target[1] = palette_[(byte&0x40) >> 3];
				target[2] = palette_[(byte&0x20) >> 2];
				target[3] = palette_[(byte&0x10) >> 1];

				target = reinterpret_cast<uint8_t *>(&palette_tables_.eighty2bpp[byte]);
				target[0] = palette_[((byte&0x80) >> 4) | ((byte&0x08) >> 2)];
				target[1] = palette_[((byte&0x40) >> 3) | ((byte&0x04) >> 1)];
				target[2] = palette_[((byte&0x20) >> 2) | ((byte&0x02) >> 0)];
				target[3] = palette_[((byte&0x10) >> 1) | ((byte&0x01) << 1)];

				target = reinterpret_cast<uint8_t *>(&palette_tables_.eighty1bpp[byte]);
				target[0] = palette_[(byte&0x80) >> 4];
				target[1] = palette_[(byte&0x40) >> 3];
				target[2] = palette_[(byte&0x20) >> 2];
				target[3] = palette_[(byte&0x10) >> 1];
				target[4] = palette_[(byte&0x08) >> 0];
				target[5] = palette_[(byte&0x04) << 1];
				target[6] = palette_[(byte&0x02) << 2];
				target[7] = palette_[(byte&0x01) << 3];

				target = reinterpret_cast<uint8_t *>(&palette_tables_.forty2bpp[byte]);
				target[0] = palette_[((byte&0x80) >> 4) | ((byte&0x08) >> 2)];
				target[1] = palette_[((byte&0x40) >> 3) | ((byte&0x04) >> 1)];

				target = reinterpret_cast<uint8_t *>(&palette_tables_.eighty4bpp[byte]);
				target[0] = palette_[((byte&0x80) >> 4) | ((byte&0x20) >> 3) | ((byte&0x08) >> 2) | ((byte&0x02) >> 1)];
				target[1] = palette_[((byte&0x40) >> 3) | ((byte&0x10) >> 2) | ((byte&0x04) >> 1) | ((byte&0x01) >> 0)];
			}
		}
		break;
	}
}